

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::StartsWith::~StartsWith(StartsWith *this)

{
  StartsWith *this_local;
  
  (this->
  super_MatcherImpl<Catch::Matchers::Impl::StdString::StartsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__StartsWith_00223cb8;
  CasedString::~CasedString(&this->m_data);
  MatcherImpl<Catch::Matchers::Impl::StdString::StartsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl(&this->
                  super_MatcherImpl<Catch::Matchers::Impl::StdString::StartsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  return;
}

Assistant:

Matchers::Impl::StdString::StartsWith::~StartsWith() {}